

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O0

int Kit_TruthXorCount(uint *pTruth0,uint *pTruth1,int nVars)

{
  int iVar1;
  int iVar2;
  int local_28;
  int local_24;
  int Counter;
  int i;
  int nWords;
  int nVars_local;
  uint *pTruth1_local;
  uint *pTruth0_local;
  
  iVar1 = Kit_TruthWordNum(nVars);
  local_28 = 0;
  for (local_24 = 0; local_24 < iVar1; local_24 = local_24 + 1) {
    iVar2 = Kit_WordCountOnes(pTruth0[local_24] ^ pTruth1[local_24]);
    local_28 = iVar2 + local_28;
  }
  return local_28;
}

Assistant:

int Kit_TruthXorCount( unsigned * pTruth0, unsigned * pTruth1, int nVars )
{
    int nWords = Kit_TruthWordNum( nVars );
    int i, Counter = 0;
    for ( i = 0; i < nWords; i++ )
        Counter += Kit_WordCountOnes( pTruth0[i] ^ pTruth1[i] );
    return Counter;
}